

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFrontFacingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlFrontFacingCaseInstance *this)

{
  TestLog *pTVar1;
  ProgramCollection<vk::ProgramBinary> *pPVar2;
  int height;
  bool bVar3;
  ConstPixelBufferAccess *pCVar4;
  VkPrimitiveTopology topology;
  void *__buf;
  void *__buf_00;
  int iVar5;
  allocator<char> local_532;
  allocator<char> local_531;
  TextureFormat local_530;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  string local_4e8;
  string local_4c8;
  DrawCallData drawCallData;
  string testDesc;
  ConstPixelBufferAccess local_480;
  LogImage local_458;
  ConstPixelBufferAccess local_3c8;
  ReferenceDrawContext refDrawContext;
  ConstPixelBufferAccess local_338;
  VulkanProgram vulkanProgram;
  FrontFacingFragmentShader fragmentShader;
  FrontFacingVertexShader vertexShader;
  DrawState drawState;
  ConstPixelBufferAccess local_278;
  ConstPixelBufferAccess local_250;
  VulkanDrawContext dc;
  
  pTVar1 = ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shaders.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rr::VertexShader::VertexShader(&vertexShader.super_VertexShader,1,0);
  vertexShader.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00bd1438;
  (vertexShader.super_VertexShader.m_inputs.
   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader(&fragmentShader.super_FragmentShader,0,1);
  fragmentShader.super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&PTR_shadeFragments_00bd1468;
  (fragmentShader.super_FragmentShader.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  testDesc._M_dataplus._M_p = (pointer)&testDesc.field_2;
  testDesc._M_string_length = 0;
  testDesc.field_2._M_local_buf[0] = '\0';
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf400000bf400000;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf40000000000000;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0x3f400000bebd70a4;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0x3f4000003ebd70a4;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf4000003f400000;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  dc.super_DrawContext._vptr_DrawContext = (_func_int **)0xbf40000000000000;
  dc.super_DrawContext.m_drawState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  dc.super_DrawContext.m_drawState.colorFormat = 0x3f800000;
  std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
  emplace_back<tcu::Vector<float,4>>
            ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&vertices,
             (Vector<float,_4> *)&dc);
  pPVar2 = ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dc,"vert",(allocator<char> *)&refDrawContext);
  local_458.m_name._M_string_length =
       (size_type)::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&dc);
  local_458.m_name._M_dataplus._M_p._0_4_ = 1;
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
  emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)&local_458);
  std::__cxx11::string::~string((string *)&dc);
  pPVar2 = ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dc,"frag",(allocator<char> *)&refDrawContext);
  local_458.m_name._M_string_length =
       (size_type)::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar2,(string *)&dc);
  local_458.m_name._M_dataplus._M_p._0_4_ = 0x10;
  std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
  emplace_back<vkt::drawutil::Shader>(&shaders,(Shader *)&local_458);
  std::__cxx11::string::~string((string *)&dc);
  drawutil::getPrimitiveTopologyShortName_abi_cxx11_
            ((string *)&refDrawContext,(drawutil *)(ulong)this->m_topology,topology);
  std::operator+(&local_458.m_name,"gl_FrontFacing ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &refDrawContext);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dc,
                 &local_458.m_name," ");
  std::__cxx11::string::operator=((string *)&testDesc,(string *)&dc);
  std::__cxx11::string::~string((string *)&dc);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&refDrawContext);
  drawutil::DrawState::DrawState(&drawState,this->m_topology,0x10,0x10);
  drawCallData.vertices = &vertices;
  vulkanProgram.shaders = &shaders;
  drawutil::VulkanDrawContext::VulkanDrawContext
            (&dc,(this->super_ShaderRenderCaseInstance).super_TestInstance.m_context,&drawState,
             &drawCallData,&vulkanProgram);
  drawutil::VulkanDrawContext::draw(&dc);
  drawutil::ReferenceDrawContext::ReferenceDrawContext
            (&refDrawContext,&drawState,&drawCallData,&vertexShader.super_VertexShader,
             &fragmentShader.super_FragmentShader);
  drawutil::ReferenceDrawContext::draw(&refDrawContext);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"reference",&local_531);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"reference",&local_532);
  drawutil::ReferenceDrawContext::getColorPixels(&local_338,&refDrawContext);
  local_530 = local_338.m_format;
  drawutil::ReferenceDrawContext::getColorPixels(&local_3c8,&refDrawContext);
  iVar5 = local_3c8.m_size.m_data[0];
  drawutil::ReferenceDrawContext::getColorPixels(&local_250,&refDrawContext);
  height = local_250.m_size.m_data[1];
  drawutil::ReferenceDrawContext::getColorPixels(&local_278,&refDrawContext);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_480,&local_530,iVar5,height,1,local_278.m_data);
  pCVar4 = &local_480;
  tcu::LogImage::LogImage(&local_458,&local_4c8,&local_4e8,pCVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
  iVar5 = (int)pTVar1;
  tcu::LogImage::write(&local_458,iVar5,__buf,(size_t)pCVar4);
  tcu::LogImage::~LogImage(&local_458);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"result",&local_531);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"result",&local_532);
  drawutil::VulkanDrawContext::getColorPixels(&local_338,&dc);
  local_530 = local_338.m_format;
  drawutil::VulkanDrawContext::getColorPixels(&local_3c8,&dc);
  drawutil::VulkanDrawContext::getColorPixels(&local_250,&dc);
  drawutil::VulkanDrawContext::getColorPixels(&local_278,&dc);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_480,&local_530,local_3c8.m_size.m_data[0],local_250.m_size.m_data[1],1,
             local_278.m_data);
  pCVar4 = &local_480;
  tcu::LogImage::LogImage(&local_458,&local_4c8,&local_4e8,pCVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_458,iVar5,__buf_00,(size_t)pCVar4);
  tcu::LogImage::~LogImage(&local_458);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  pTVar1 = ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  drawutil::ReferenceDrawContext::getColorPixels
            ((ConstPixelBufferAccess *)&local_458,&refDrawContext);
  drawutil::VulkanDrawContext::getColorPixels(&local_480,&dc);
  tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&local_338,0);
  local_3c8.m_format.order = A;
  local_3c8.m_format.type = SNORM_INT16;
  local_3c8.m_size.m_data[0] = 0;
  bVar3 = tcu::intThresholdPositionDeviationCompare
                    (pTVar1,"ComparisonResult","Image comparison result",
                     (ConstPixelBufferAccess *)&local_458,&local_480,(UVec4 *)&local_338,
                     (IVec3 *)&local_3c8,false,COMPARE_LOG_RESULT);
  if (bVar3) {
    std::__cxx11::string::append((char *)&testDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,testDesc._M_dataplus._M_p,(allocator<char> *)&local_480);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_458.m_name);
  }
  else {
    std::__cxx11::string::append((char *)&testDesc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,testDesc._M_dataplus._M_p,(allocator<char> *)&local_480);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_458.m_name);
  }
  std::__cxx11::string::~string((string *)&local_458);
  drawutil::ReferenceDrawContext::~ReferenceDrawContext(&refDrawContext);
  drawutil::VulkanDrawContext::~VulkanDrawContext(&dc);
  std::__cxx11::string::~string((string *)&testDesc);
  rr::FragmentShader::~FragmentShader(&fragmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&vertexShader.super_VertexShader);
  std::_Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::~_Vector_base
            (&shaders.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&vertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return __return_storage_ptr__;
}

Assistant:

TestStatus BuiltinGlFrontFacingCaseInstance::iterate (void)
{
	TestLog&					log				= m_context.getTestContext().getLog();
	std::vector<Vec4>			vertices;
	std::vector<Shader>			shaders;
	FrontFacingVertexShader		vertexShader;
	FrontFacingFragmentShader	fragmentShader;
	std::string					testDesc;

	vertices.push_back(Vec4( -0.75f,	-0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.0f,		-0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4( -0.37f,	0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.37f,	0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.75f,	-0.75f,	0.0f,	1.0f));
	vertices.push_back(Vec4(  0.0f,		-0.75f,	0.0f,	1.0f));

	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT, m_context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT, m_context.getBinaryCollection().get("frag")));

	testDesc = "gl_FrontFacing " + getPrimitiveTopologyShortName(m_topology) + " ";

	DrawState					drawState		(m_topology, FRONTFACE_RENDERWIDTH, FRONTFACE_RENDERHEIGHT);
	DrawCallData				drawCallData	(vertices);
	VulkanProgram				vulkanProgram	(shaders);

	VulkanDrawContext			dc(m_context, drawState, drawCallData, vulkanProgram);
	dc.draw();

	ReferenceDrawContext		refDrawContext(drawState, drawCallData, vertexShader, fragmentShader);
	refDrawContext.draw();

	log << TestLog::Image( "reference",
							"reference",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									refDrawContext.getColorPixels().getFormat()),
									refDrawContext.getColorPixels().getWidth(),
									refDrawContext.getColorPixels().getHeight(),
									1,
									refDrawContext.getColorPixels().getDataPtr()));

	log << TestLog::Image(	"result",
							"result",
							tcu::ConstPixelBufferAccess(tcu::TextureFormat(
									dc.getColorPixels().getFormat()),
									dc.getColorPixels().getWidth(),
									dc.getColorPixels().getHeight(),
									1,
									dc.getColorPixels().getDataPtr()));

	if (tcu::intThresholdPositionDeviationCompare(m_context.getTestContext().getLog(),
												  "ComparisonResult",
												  "Image comparison result",
												  refDrawContext.getColorPixels(),
												  dc.getColorPixels(),
												  UVec4(0u),
												  IVec3(1,1,0),
												  false,
												  tcu::COMPARE_LOG_RESULT))
	{
		testDesc += "passed";
		return tcu::TestStatus::pass(testDesc.c_str());
	}
	else
	{
		testDesc += "failed";
		return tcu::TestStatus::fail(testDesc.c_str());
	}
}